

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O3

char * tcmalloc::DoWithWriterToStrDup
                 (ChunkedWriterConfig *config,_func_void_GenericWriter_ptr_void_ptr *body,void *arg)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  long lVar4;
  size_t __n;
  GenericWriter local_60;
  ChunkedWriterConfig **local_40;
  ChunkedWriterConfig *local_38;
  long *local_30;
  
  local_40 = &local_38;
  local_30 = (long *)0x0;
  local_60.buf_end_ = (char *)0x0;
  local_60.buf_ = (char *)0x0;
  local_60.buf_fill_ = (char *)0x0;
  local_60._vptr_GenericWriter = (_func_int **)&PTR__ChunkedStorageWriter_0014bf90;
  local_38 = config;
  (*body)(&local_60,arg);
  plVar3 = local_30;
  if (local_40[1] != (ChunkedWriterConfig *)0x0) {
    *(int *)((long)&local_40[1]->chunk_free + 4) = (int)local_60.buf_fill_ - (int)local_60.buf_;
  }
  if (local_30 == (long *)0x0) {
    pcVar2 = (char *)malloc(1);
    *pcVar2 = '\0';
  }
  else {
    lVar4 = 0;
    plVar1 = local_30;
    do {
      lVar4 = lVar4 + *(int *)((long)plVar1 + 0xc);
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
    pcVar2 = (char *)malloc(lVar4 + 1);
    pcVar2[lVar4] = '\0';
    do {
      __n = (size_t)*(int *)((long)plVar3 + 0xc);
      memcpy(pcVar2 + (lVar4 - __n),plVar3 + 2,__n);
      lVar4 = lVar4 - __n;
      plVar1 = (long *)*plVar3;
      (*local_38->chunk_free)(plVar3);
      plVar3 = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return pcVar2;
}

Assistant:

char* DoWithWriterToStrDup(const ChunkedWriterConfig& config, void (*body)(GenericWriter* writer, void* arg), void* arg) {
  ChunkedStorage storage(config);
  {
    ChunkedStorageWriter writer{&storage};
    body(&writer, arg);
    // Ensure writer is destroyed and releases it's entire output
    // into storage.
  }
  return storage.StrDupAndRelease();
}